

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O2

bool __thiscall ithipublisher::CollectMetricFiles(ithipublisher *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pp_Var3;
  _MetricFileHolder *p_Var4;
  __normal_iterator<_MetricFileHolder_**,_std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>_>
  __first;
  __normal_iterator<_MetricFileHolder_**,_std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>_>
  __last;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  DIR *__dirp;
  dirent *pdVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  MetricFileHolder *pmfh;
  MetricFileHolder met_file;
  char dir_met_name [512];
  value_type local_350;
  MetricFileHolder local_344;
  char local_238 [520];
  
  iVar8 = snprintf(local_238,0x200,"%s%sM%d%s",this->ithi_folder,"/",(ulong)(uint)this->metric_id,
                   "/");
  if ((0 < iVar8) && (__dirp = opendir(local_238), __dirp != (DIR *)0x0)) {
LAB_0016b6c4:
    pdVar9 = readdir(__dirp);
    if (pdVar9 != (dirent *)0x0) {
      bVar7 = ParseFileName(&local_344,pdVar9->d_name,this->metric_id);
      if (bVar7) {
        pp_Var3 = (this->file_list).
                  super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        for (lVar10 = 0;
            (long)(this->file_list).
                  super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var3 >> 3 != lVar10;
            lVar10 = lVar10 + 1) {
          p_Var4 = pp_Var3[lVar10];
          if ((p_Var4->year == local_344.year) && (p_Var4->month == local_344.month)) {
            if (p_Var4->day <= local_344.day) {
              memcpy(p_Var4,&local_344,0x10c);
            }
            goto LAB_0016b6c4;
          }
        }
        local_350 = (value_type)operator_new(0x10c);
        memcpy(local_350,&local_344,0x10c);
        std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::push_back
                  (&this->file_list,&local_350);
      }
      goto LAB_0016b6c4;
    }
    closedir(__dirp);
    __first._M_current =
         (this->file_list).
         super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->file_list).
         super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__last._M_current != __first._M_current) {
      std::
      __sort<__gnu_cxx::__normal_iterator<_MetricFileHolder**,std::vector<_MetricFileHolder*,std::allocator<_MetricFileHolder*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_MetricFileHolder*,_MetricFileHolder*)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(_MetricFileHolder_*,__MetricFileHolder_*)>)0x16b8e4);
      pp_Var3 = (this->file_list).
                super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      p_Var4 = (this->file_list).
               super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
      iVar8 = p_Var4->year;
      this->last_year = iVar8;
      uVar1 = p_Var4->month;
      uVar5 = p_Var4->day;
      p_Var4 = *pp_Var3;
      uVar2 = p_Var4->year;
      uVar6 = p_Var4->month;
      this->last_month = uVar1;
      this->last_day = uVar5;
      this->first_year = uVar2;
      this->first_month = uVar6;
      this->nb_months = (iVar8 - uVar2) * 0xc + (uVar1 - uVar6) + 1;
      bVar7 = true;
      uVar11 = 0;
      while( true ) {
        if (bVar7 == false) {
          return false;
        }
        if ((ulong)((long)(this->file_list).
                          super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->file_list).
                          super__Vector_base<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar11) break;
        bVar7 = LoadFileData(this,(int)uVar11,local_238);
        uVar11 = uVar11 + 1;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<_metric_line**,std::vector<_metric_line*,std::allocator<_metric_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_line*,_metric_line*)>>
                ((__normal_iterator<_metric_line_**,_std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>_>
                  )(this->line_list).
                   super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<_metric_line_**,_std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>_>
                  )(this->line_list).
                   super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(_metric_line_*,__metric_line_*)>)0x16ba88);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool ithipublisher::CollectMetricFiles()
{
    char dir_met_name[512];
    bool ret = snprintf(dir_met_name, sizeof(dir_met_name), "%s%sM%d%s", ithi_folder, ITHI_FILE_PATH_SEP, metric_id, ITHI_FILE_PATH_SEP) > 0;

    if (ret)
    {
        DIR *dir_met;

        dir_met = opendir(dir_met_name);
        if (dir_met == NULL)
        {
            ret = false;
        }
        else
        {
            struct dirent *file_ent;

            while (ret && (file_ent = readdir(dir_met)) != NULL)
            {
                MetricFileHolder met_file;

                if (ParseFileName(&met_file, file_ent->d_name, metric_id))
                {
                    /* Check whether this is the latest in list for the month */
                    bool found_already = false;

                    for (size_t i = 0; i < file_list.size(); i++)
                    {
                        if (file_list[i]->year == met_file.year &&
                            file_list[i]->month == met_file.month)
                        {
                            if (met_file.day >= file_list[i]->day)
                            {
                                *(file_list[i]) = met_file;
                            }
                            found_already = true;
                            break;
                        }
                    }

                    if (!found_already)
                    {
                        MetricFileHolder * pmfh = new MetricFileHolder();

                        if (pmfh == NULL)
                        {
                            ret = false;
                        }
                        else
                        {
                            *pmfh = met_file;
                            file_list.push_back(pmfh);
                        }
                    }
                }
            }

            closedir(dir_met);

            ret = file_list.size() > 0;
        }
    }

    if (ret)
    {
        /* Sort the file list from earlier to last */
        std::sort(file_list.begin(), file_list.end(), ithipublisher::MetricFileIsEarlier);

        /* Compute the first and last year and months */
        size_t last_index = file_list.size() - 1;
        last_year = file_list[last_index]->year;
        last_month = file_list[last_index]->month;
        last_day = file_list[last_index]->day;
        first_year = file_list[0]->year;
        first_month = file_list[0]->month;

        nb_months = 1 + last_month - first_month + 12 * (last_year - first_year);

        /* Load the selected data */
        for (size_t i = 0; ret &&  i < file_list.size(); i++)
        {
            ret = LoadFileData((int)i, dir_met_name);
        }

        if (ret)
        {
            std::sort(line_list.begin(), line_list.end(), MetricLineIsLower);
        }
    }

    return ret;
}